

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::StrpTimeFormat>
          (Deserializer *this,field_id_t field_id,char *tag,StrpTimeFormat *ret)

{
  undefined6 in_register_00000032;
  StrTimeFormat local_90;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::StrpTimeFormat>((type *)&local_90,this);
  StrTimeFormat::operator=(&ret->super_StrTimeFormat,&local_90);
  StrTimeFormat::~StrTimeFormat(&local_90);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}